

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# insertproxymodel.cpp
# Opt level: O0

bool __thiscall InsertProxyModelPrivate::commitToSource(InsertProxyModelPrivate *this,bool isRow)

{
  InsertProxyModel *pIVar1;
  bool bVar2;
  Int IVar3;
  int iVar4;
  long lVar5;
  long *plVar6;
  QAbstractItemModel *pQVar7;
  RolesContainer *pRVar8;
  ulong uVar9;
  size_type_conflict1 asize;
  int *piVar10;
  int local_1c4;
  bool local_1a1;
  QModelIndex local_188;
  QModelIndex local_170;
  undefined1 local_158 [8];
  QModelIndex proxyIdx;
  iterator local_130;
  iterator j;
  undefined1 local_118 [8];
  QVector<int> aggregateRoles;
  QModelIndex local_e8;
  undefined1 local_d0 [8];
  QModelIndex currentIdx;
  RolesContainer *allRoles;
  int i;
  int loopEnd;
  QModelIndex local_90;
  QModelIndex local_78;
  int local_5c;
  int sourceRows;
  int local_3c;
  Int local_38;
  int sourceCols;
  Int local_30;
  bool canInsRow;
  InsertProxyModel *pIStack_28;
  bool canInsCol;
  InsertProxyModel *q;
  InsertProxyModelPrivate *pIStack_18;
  bool isRow_local;
  InsertProxyModelPrivate *this_local;
  
  q._7_1_ = isRow;
  pIStack_18 = this;
  pIStack_28 = q_func(this);
  lVar5 = QAbstractProxyModel::sourceModel();
  if (lVar5 == 0) {
    this_local._7_1_ = false;
  }
  else {
    local_30 = (Int)QFlags<InsertProxyModel::InsertDirection>::operator&
                              (&this->m_insertDirection,InsertColumn);
    IVar3 = QFlags::operator_cast_to_unsigned_int((QFlags *)&local_30);
    canInsRow = IVar3 != 0;
    local_38 = (Int)QFlags<InsertProxyModel::InsertDirection>::operator&
                              (&this->m_insertDirection,InsertRow);
    IVar3 = QFlags::operator_cast_to_unsigned_int((QFlags *)&local_38);
    sourceCols._3_1_ = IVar3 != 0;
    if ((((q._7_1_ & 1) != 0) && ((bool)sourceCols._3_1_)) ||
       (((q._7_1_ & 1) == 0 && ((canInsRow & 1U) != 0)))) {
      plVar6 = (long *)QAbstractProxyModel::sourceModel();
      QModelIndex::QModelIndex((QModelIndex *)&stack0xffffffffffffffa8);
      local_3c = (**(code **)(*plVar6 + 0x80))(plVar6,&stack0xffffffffffffffa8);
      plVar6 = (long *)QAbstractProxyModel::sourceModel();
      QModelIndex::QModelIndex(&local_78);
      local_5c = (**(code **)(*plVar6 + 0x78))(plVar6,&local_78);
      if ((q._7_1_ & 1) == 0) {
        pQVar7 = (QAbstractItemModel *)QAbstractProxyModel::sourceModel();
        iVar4 = local_3c;
        QModelIndex::QModelIndex((QModelIndex *)&i);
        local_1a1 = QAbstractItemModel::insertColumn(pQVar7,iVar4,(QModelIndex *)&i);
      }
      else {
        pQVar7 = (QAbstractItemModel *)QAbstractProxyModel::sourceModel();
        iVar4 = local_5c;
        QModelIndex::QModelIndex(&local_90);
        local_1a1 = QAbstractItemModel::insertRow(pQVar7,iVar4,&local_90);
      }
      if (((local_1a1 ^ 0xffU) & 1) == 0) {
        if ((q._7_1_ & 1) == 0) {
          local_1c4 = local_5c;
        }
        else {
          local_1c4 = local_3c;
        }
        for (allRoles._0_4_ = 0; (int)allRoles < local_1c4; allRoles._0_4_ = (int)allRoles + 1) {
          currentIdx.m = (QAbstractItemModel *)
                         QList<QMap<int,_QVariant>_>::operator[]
                                   (this->m_extraData + (q._7_1_ & 1),(long)(int)allRoles);
          bVar2 = QMap<int,_QVariant>::isEmpty((QMap<int,_QVariant> *)currentIdx.m);
          if (!bVar2) {
            if ((q._7_1_ & 1) == 0) {
              plVar6 = (long *)QAbstractProxyModel::sourceModel();
              iVar4 = local_3c;
              QModelIndex::QModelIndex((QModelIndex *)&aggregateRoles.d.size);
              (**(code **)(*plVar6 + 0x60))
                        (local_d0,plVar6,(int)allRoles,iVar4,&aggregateRoles.d.size);
            }
            else {
              plVar6 = (long *)QAbstractProxyModel::sourceModel();
              iVar4 = local_5c;
              QModelIndex::QModelIndex(&local_e8);
              (**(code **)(*plVar6 + 0x60))(local_d0,plVar6,iVar4,(int)allRoles,&local_e8);
            }
            plVar6 = (long *)QAbstractProxyModel::sourceModel();
            pRVar8 = convertFromContainer<QMap<int,QVariant>,void>((RolesContainer *)currentIdx.m);
            uVar9 = (**(code **)(*plVar6 + 0xb8))(plVar6,local_d0,pRVar8);
            if ((uVar9 & 1) == 0) {
              return false;
            }
            QList<int>::QList((QList<int> *)local_118);
            asize = QMap<int,_QVariant>::size((QMap<int,_QVariant> *)currentIdx.m);
            QList<int>::reserve((QList<int> *)local_118,asize);
            local_130._M_node =
                 (_Base_ptr)QMap<int,_QVariant>::begin((QMap<int,_QVariant> *)currentIdx.m);
            while (bVar2 = QMap<int,_QVariant>::isEmpty((QMap<int,_QVariant> *)currentIdx.m),
                  pIVar1 = pIStack_28, ((bVar2 ^ 0xffU) & 1) != 0) {
              piVar10 = QMap<int,_QVariant>::iterator::key((iterator *)&local_130);
              QList<int>::operator<<((QList<int> *)local_118,*piVar10);
              pQVar7 = currentIdx.m;
              QMap<int,_QVariant>::const_iterator::const_iterator
                        ((const_iterator *)&proxyIdx.m,(iterator *)&local_130);
              local_130._M_node =
                   (_Base_ptr)
                   QMap<int,_QVariant>::erase
                             ((QMap<int,_QVariant> *)pQVar7,(const_iterator)proxyIdx.m);
            }
            if ((q._7_1_ & 1) == 0) {
              iVar4 = local_3c + 1;
              QModelIndex::QModelIndex(&local_188);
              (**(code **)(*(long *)pIVar1 + 0x60))(local_158,pIVar1,(int)allRoles,iVar4,&local_188)
              ;
            }
            else {
              iVar4 = local_5c + 1;
              QModelIndex::QModelIndex(&local_170);
              (**(code **)(*(long *)pIVar1 + 0x60))(local_158,pIVar1,iVar4,(int)allRoles,&local_170)
              ;
            }
            QAbstractItemModel::dataChanged
                      ((QModelIndex *)pIStack_28,(QModelIndex *)local_158,
                       (QList_conflict2 *)local_158);
            InsertProxyModel::extraDataChanged
                      (pIStack_28,(QModelIndex *)local_158,(QModelIndex *)local_158,
                       (QVector<int> *)local_118);
            QList<int>::~QList((QList<int> *)local_118);
          }
        }
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool InsertProxyModelPrivate::commitToSource(const bool isRow)
{
    Q_Q(InsertProxyModel);
    if (!q->sourceModel())
        return false;
    const bool canInsCol = m_insertDirection & InsertProxyModel::InsertColumn;
    const bool canInsRow = m_insertDirection & InsertProxyModel::InsertRow;
    if (!((isRow && canInsRow) || (!isRow && canInsCol)))
        return false;
    const int sourceCols = q->sourceModel()->columnCount();
    const int sourceRows = q->sourceModel()->rowCount();
    if (!(isRow ? q->sourceModel()->insertRow(sourceRows) : q->sourceModel()->insertColumn(sourceCols)))
        return false;
    const int loopEnd = isRow ? sourceCols : sourceRows;
    for (int i = 0; i < loopEnd; ++i) {
        RolesContainer &allRoles = m_extraData[isRow][i];
        if (allRoles.isEmpty())
            continue;
        const QModelIndex currentIdx = isRow ? q->sourceModel()->index(sourceRows, i) : q->sourceModel()->index(i, sourceCols);
        Q_ASSERT(m_separateEditDisplay || (allRoles.contains(Qt::DisplayRole) == allRoles.contains(Qt::EditRole)));
        Q_ASSERT(m_separateEditDisplay || (allRoles.value(Qt::DisplayRole) == allRoles.value(Qt::EditRole)));
        if (!q->sourceModel()->setItemData(currentIdx, convertFromContainer<QMap<int, QVariant>>(allRoles)))
            return false;
        QVector<int> aggregateRoles;
        aggregateRoles.reserve(allRoles.size());
        for (auto j = allRoles.begin(); !allRoles.isEmpty(); j = allRoles.erase(j))
            aggregateRoles << j.key();
        const QModelIndex proxyIdx = isRow ? q->index(sourceRows + 1, i) : q->index(i, sourceCols + 1);
        Q_EMIT q->dataChanged(proxyIdx, proxyIdx, aggregateRoles);
        Q_EMIT q->extraDataChanged(proxyIdx, proxyIdx, aggregateRoles);
    }
    return true;
}